

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O0

bool __thiscall Json::OurReader::readCStyleComment(OurReader *this,bool *containsNewLineResult)

{
  Char CVar1;
  Char c;
  bool *containsNewLineResult_local;
  OurReader *this_local;
  
  *containsNewLineResult = false;
  while ((this->current_ + 1 < this->end_ &&
         ((CVar1 = getNextChar(this), CVar1 != '*' || (*this->current_ != '/'))))) {
    if (CVar1 == '\n') {
      *containsNewLineResult = true;
    }
  }
  CVar1 = getNextChar(this);
  return CVar1 == '/';
}

Assistant:

bool OurReader::readCStyleComment(bool* containsNewLineResult) {
  *containsNewLineResult = false;

  while ((current_ + 1) < end_) {
    Char c = getNextChar();
    if (c == '*' && *current_ == '/')
      break;
    if (c == '\n')
      *containsNewLineResult = true;
  }

  return getNextChar() == '/';
}